

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitTry(FunctionValidator *this,Try *curr)

{
  Expression *o;
  char *pcVar1;
  string_view name;
  bool bVar2;
  Module *pMVar3;
  ExpressionList *pEVar4;
  size_t sVar5;
  size_t sVar6;
  Name *pNVar7;
  Tag *pTVar8;
  ostream *poVar9;
  Expression **ppEVar10;
  value_type *ppPVar11;
  char *pcVar12;
  Try *pTVar13;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  IteratorBase<wasm::SmallVector<wasm::Pop_*,_1UL>,_wasm::SmallVector<wasm::Pop_*,_1UL>::Iterator>
  IVar14;
  bool local_211;
  SmallVector<wasm::Pop_*,_1UL> local_1f8;
  Expression *local_1d0;
  Expression *catchAllBody;
  char *pcStack_1c0;
  Expression *local_1b8;
  char *pcStack_1b0;
  Expression *local_1a8;
  char *pcStack_1a0;
  uintptr_t local_190;
  uintptr_t local_188;
  IteratorBase<wasm::SmallVector<wasm::Pop_*,_1UL>,_wasm::SmallVector<wasm::Pop_*,_1UL>::Iterator>
  local_180;
  value_type local_170;
  Pop *pop;
  char *pcStack_160;
  BasicType local_144;
  undefined1 local_140 [8];
  SmallVector<wasm::Pop_*,_1UL> pops;
  Expression *catchBody_2;
  Tag *tag;
  Name tagName;
  Type TStack_d0;
  Index i;
  Type local_c8;
  Expression *local_c0;
  Expression *catchBody_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  ExpressionList *__range2_1;
  Type local_88;
  uintptr_t local_80;
  uintptr_t local_78;
  Expression *local_70;
  Expression *catchBody;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  BasicType local_2c;
  size_t local_28;
  char *local_20;
  Try *local_18;
  Try *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (Try *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasExceptionHandling(&pMVar3->features);
  shouldBeTrue<wasm::Try*>
            (this,bVar2,local_18,"try requires exception-handling [--enable-exception-handling]");
  bVar2 = IString::is(&(local_18->name).super_IString);
  if (bVar2) {
    local_28 = (local_18->name).super_IString.str._M_len;
    local_20 = (local_18->name).super_IString.str._M_str;
    noteLabelName(this,(Name)(local_18->name).super_IString.str);
  }
  local_2c = unreachable;
  bVar2 = wasm::Type::operator!=
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)49>).
                      super_Expression.type,&local_2c);
  if (bVar2) {
    shouldBeSubType(this,(Type)(local_18->body->type).id,
                    (Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)49>).
                          super_Expression.type.id,local_18->body,
                    "try\'s type does not match try body\'s type");
    pEVar4 = &local_18->catchBodies;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&pEVar4->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _catchBody = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                           (&pEVar4->
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
    while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&catchBody), bVar2) {
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&__end2.index);
      local_70 = *ppEVar10;
      local_78 = (local_70->type).id;
      local_80 = (local_18->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.
                 type.id;
      shouldBeSubType(this,(Type)local_78,(Type)local_80,local_70,
                      "try\'s type does not match catch\'s body type");
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
  }
  else {
    local_88.id = (local_18->body->type).id;
    wasm::Type::Type((Type *)&__range2_1,unreachable);
    shouldBeEqual<wasm::Try*,wasm::Type>
              (this,local_88,(Type)__range2_1,local_18,
               "unreachable try-catch must have unreachable try body");
    pEVar4 = &local_18->catchBodies;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&pEVar4->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _catchBody_1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                             (&pEVar4->
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             );
    while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2_1.index,(Iterator *)&catchBody_1), bVar2) {
      ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&__end2_1.index);
      local_c0 = *ppEVar10;
      local_c8.id = (local_c0->type).id;
      wasm::Type::Type(&stack0xffffffffffffff30,unreachable);
      shouldBeEqual<wasm::Try*,wasm::Type>
                (this,local_c8,TStack_d0,local_18,
                 "unreachable try-catch must have unreachable catch body");
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2_1.index);
    }
  }
  sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(local_18->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  sVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    (&(local_18->catchTags).
                      super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  shouldBeTrue<wasm::Try*>
            (this,sVar5 - sVar6 < 2,local_18,"the number of catch blocks and tags do not match");
  bVar2 = Try::isCatch(local_18);
  local_211 = false;
  if (bVar2) {
    local_211 = Try::isDelegate(local_18);
  }
  shouldBeFalse<wasm::Try*>
            (this,local_211,local_18,"try cannot have both catch and delegate at the same time");
  tagName.super_IString.str._M_str._4_4_ = 0;
  while( true ) {
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(local_18->catchTags).
                        super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar5 <= tagName.super_IString.str._M_str._4_4_) break;
    pNVar7 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(local_18->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                        (ulong)tagName.super_IString.str._M_str._4_4_);
    o = (Expression *)(pNVar7->super_IString).str._M_len;
    pcVar1 = (pNVar7->super_IString).str._M_str;
    name = (pNVar7->super_IString).str;
    pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    pTVar8 = Module::getTagOrNull(pMVar3,(Name)name);
    pcVar12 = "";
    bVar2 = shouldBeTrue<wasm::Try*>(this,pTVar8 != (Tag *)0x0,local_18,"");
    if (!bVar2) {
      poVar9 = getStream(this);
      poVar9 = std::operator<<(poVar9,"tag name is invalid: ");
      name_00.super_IString.str._M_str = pcVar12;
      name_00.super_IString.str._M_len = (size_t)pcVar1;
      poVar9 = wasm::operator<<((wasm *)poVar9,(ostream *)o,name_00);
      std::operator<<(poVar9,"\n");
    }
    ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(local_18->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,(ulong)tagName.super_IString.str._M_str._4_4_);
    pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppEVar10;
    EHUtils::findPops((SmallVector<wasm::Pop_*,_1UL> *)local_140,
                      (Expression *)
                      pops.flexible.super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_144 = none;
    bVar2 = wasm::Type::operator==(&(pTVar8->sig).params,&local_144);
    if (bVar2) {
      bVar2 = SmallVector<wasm::Pop_*,_1UL>::empty((SmallVector<wasm::Pop_*,_1UL> *)local_140);
      pcVar12 = "";
      bVar2 = shouldBeTrue<wasm::Try*>(this,bVar2,local_18,"");
      if (!bVar2) {
        poVar9 = getStream(this);
        poVar9 = std::operator<<(poVar9,"catch\'s tag (");
        name_01.super_IString.str._M_str = pcVar12;
        name_01.super_IString.str._M_len = (size_t)pcVar1;
        pop = (Pop *)o;
        pcStack_160 = pcVar1;
        poVar9 = wasm::operator<<((wasm *)poVar9,(ostream *)o,name_01);
        std::operator<<(poVar9,") doesn\'t have any params, but there are pops");
      }
    }
    else {
      sVar5 = SmallVector<wasm::Pop_*,_1UL>::size((SmallVector<wasm::Pop_*,_1UL> *)local_140);
      pcVar12 = "";
      bVar2 = shouldBeTrue<wasm::Try*>(this,sVar5 == 1,local_18,"");
      if (bVar2) {
        IVar14 = (IteratorBase<wasm::SmallVector<wasm::Pop_*,_1UL>,_wasm::SmallVector<wasm::Pop_*,_1UL>::Iterator>
                  )SmallVector<wasm::Pop_*,_1UL>::begin((SmallVector<wasm::Pop_*,_1UL> *)local_140);
        local_180 = IVar14;
        ppPVar11 = SmallVector<wasm::Pop_*,_1UL>::Iterator::operator*((Iterator *)&local_180);
        local_170 = *ppPVar11;
        local_188 = (pTVar8->sig).params.id;
        local_190 = (local_170->super_SpecificExpression<(wasm::Expression::Id)40>).super_Expression
                    .type.id;
        pTVar13 = local_18;
        bVar2 = shouldBeSubType(this,(Type)local_188,(Type)local_190,(Expression *)local_18,"");
        if (!bVar2) {
          poVar9 = getStream(this);
          poVar9 = std::operator<<(poVar9,"catch\'s tag (");
          name_02.super_IString.str._M_str = (char *)pTVar13;
          name_02.super_IString.str._M_len = (size_t)pcVar1;
          local_1a8 = o;
          pcStack_1a0 = pcVar1;
          poVar9 = wasm::operator<<((wasm *)poVar9,(ostream *)o,name_02);
          std::operator<<(poVar9,")\'s pop doesn\'t have the same type as the tag\'s params");
        }
        bVar2 = EHUtils::containsValidDanglingPop
                          ((Expression *)
                           pops.flexible.
                           super__Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        pcVar12 = "";
        bVar2 = shouldBeTrue<wasm::Try*>(this,bVar2,local_18,"");
        if (!bVar2) {
          poVar9 = getStream(this);
          poVar9 = std::operator<<(poVar9,"catch\'s body (");
          name_03.super_IString.str._M_str = pcVar12;
          name_03.super_IString.str._M_len = (size_t)pcVar1;
          local_1b8 = o;
          pcStack_1b0 = pcVar1;
          poVar9 = wasm::operator<<((wasm *)poVar9,(ostream *)o,name_03);
          std::operator<<(poVar9,")\'s pop\'s location is not valid");
        }
      }
      else {
        poVar9 = getStream(this);
        poVar9 = std::operator<<(poVar9,"catch\'s tag (");
        name_04.super_IString.str._M_str = pcVar12;
        name_04.super_IString.str._M_len = (size_t)pcVar1;
        catchAllBody = o;
        pcStack_1c0 = pcVar1;
        poVar9 = wasm::operator<<((wasm *)poVar9,(ostream *)o,name_04);
        std::operator<<(poVar9,") has params, so there should be a single pop within the catch body"
                       );
      }
    }
    SmallVector<wasm::Pop_*,_1UL>::~SmallVector((SmallVector<wasm::Pop_*,_1UL> *)local_140);
    tagName.super_IString.str._M_str._4_4_ = tagName.super_IString.str._M_str._4_4_ + 1;
  }
  bVar2 = Try::hasCatchAll(local_18);
  if (bVar2) {
    ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                         (&(local_18->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    local_1d0 = *ppEVar10;
    EHUtils::findPops(&local_1f8,local_1d0);
    bVar2 = SmallVector<wasm::Pop_*,_1UL>::empty(&local_1f8);
    shouldBeTrue<wasm::Try*>(this,bVar2,local_18,"catch_all\'s body should not have pops");
    SmallVector<wasm::Pop_*,_1UL>::~SmallVector(&local_1f8);
  }
  bVar2 = Try::isDelegate(local_18);
  if (bVar2) {
    noteDelegate(this,(Name)(local_18->delegateTarget).super_IString.str,(Expression *)local_18);
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::erase(&this->rethrowTargetNames,&local_18->name);
  return;
}

Assistant:

void FunctionValidator::visitTry(Try* curr) {
  shouldBeTrue(getModule()->features.hasExceptionHandling(),
               curr,
               "try requires exception-handling [--enable-exception-handling]");
  if (curr->name.is()) {
    noteLabelName(curr->name);
  }
  if (curr->type != Type::unreachable) {
    shouldBeSubType(curr->body->type,
                    curr->type,
                    curr->body,
                    "try's type does not match try body's type");
    for (auto catchBody : curr->catchBodies) {
      shouldBeSubType(catchBody->type,
                      curr->type,
                      catchBody,
                      "try's type does not match catch's body type");
    }
  } else {
    shouldBeEqual(curr->body->type,
                  Type(Type::unreachable),
                  curr,
                  "unreachable try-catch must have unreachable try body");
    for (auto catchBody : curr->catchBodies) {
      shouldBeEqual(catchBody->type,
                    Type(Type::unreachable),
                    curr,
                    "unreachable try-catch must have unreachable catch body");
    }
  }
  shouldBeTrue(curr->catchBodies.size() - curr->catchTags.size() <= 1,
               curr,
               "the number of catch blocks and tags do not match");

  shouldBeFalse(curr->isCatch() && curr->isDelegate(),
                curr,
                "try cannot have both catch and delegate at the same time");

  for (Index i = 0; i < curr->catchTags.size(); i++) {
    Name tagName = curr->catchTags[i];
    auto* tag = getModule()->getTagOrNull(tagName);
    if (!shouldBeTrue(tag != nullptr, curr, "")) {
      getStream() << "tag name is invalid: " << tagName << "\n";
    }

    auto* catchBody = curr->catchBodies[i];
    auto pops = EHUtils::findPops(catchBody);
    if (tag->sig.params == Type::none) {
      if (!shouldBeTrue(pops.empty(), curr, "")) {
        getStream() << "catch's tag (" << tagName
                    << ") doesn't have any params, but there are pops";
      }
    } else {
      if (shouldBeTrue(pops.size() == 1, curr, "")) {
        auto* pop = *pops.begin();
        if (!shouldBeSubType(tag->sig.params, pop->type, curr, "")) {
          getStream()
            << "catch's tag (" << tagName
            << ")'s pop doesn't have the same type as the tag's params";
        }
        if (!shouldBeTrue(
              EHUtils::containsValidDanglingPop(catchBody), curr, "")) {
          getStream() << "catch's body (" << tagName
                      << ")'s pop's location is not valid";
        }
      } else {
        getStream() << "catch's tag (" << tagName
                    << ") has params, so there should be a single pop within "
                       "the catch body";
      }
    }
  }

  if (curr->hasCatchAll()) {
    auto* catchAllBody = curr->catchBodies.back();
    shouldBeTrue(EHUtils::findPops(catchAllBody).empty(),
                 curr,
                 "catch_all's body should not have pops");
  }

  if (curr->isDelegate()) {
    noteDelegate(curr->delegateTarget, curr);
  }

  rethrowTargetNames.erase(curr->name);
}